

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.hpp
# Opt level: O2

unique_ptr<double,_std::default_delete<double>_> __thiscall
strq::Generator<std::unique_ptr<double,std::default_delete<double>>,void>::operator()
          (Generator<std::unique_ptr<double,std::default_delete<double>>,void> *this,
          Compound<strq::Arithmetic<std::normal_distribution<double>_>_> *schema)

{
  double *pdVar1;
  Arithmetic<std::normal_distribution<double>_> *in_RDX;
  double dVar2;
  
  pdVar1 = (double *)operator_new(8);
  dVar2 = random<double,strq::Arithmetic<std::normal_distribution<double>>const&>(in_RDX);
  *pdVar1 = dVar2;
  *(double **)this = pdVar1;
  return (__uniq_ptr_data<double,_std::default_delete<double>,_true,_true>)
         (__uniq_ptr_data<double,_std::default_delete<double>,_true,_true>)this;
}

Assistant:

auto operator() (Schema&& schema) -> T
        {
            return T {new typename T::element_type {
                    random<typename T::element_type>(std::get<0>(schema.values()))
            }};
        }